

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduction.hpp
# Opt level: O0

vector<int,_std::allocator<int>_> * __thiscall
mxx::allreduce<int,std::plus<int>>
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,mxx *this,comm *in,undefined8 n
          )

{
  comm *pcVar1;
  size_t sVar2;
  reference pvVar3;
  allocator<int> local_32;
  undefined1 local_31;
  undefined8 local_30;
  comm *comm_local;
  size_t n_local;
  int *in_local;
  vector<int,_std::allocator<int>_> *local_10;
  vector<int,_std::allocator<int>_> *result;
  
  local_31 = 0;
  local_30 = n;
  comm_local = in;
  n_local = (size_t)this;
  local_10 = __return_storage_ptr__;
  std::allocator<int>::allocator(&local_32);
  std::vector<int,_std::allocator<int>_>::vector(__return_storage_ptr__,(size_type)in,&local_32);
  std::allocator<int>::~allocator(&local_32);
  sVar2 = n_local;
  pcVar1 = comm_local;
  pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](__return_storage_ptr__,0);
  allreduce<int,std::plus<int>>(sVar2,pcVar1,pvVar3,local_30);
  return __return_storage_ptr__;
}

Assistant:

inline std::vector<T> allreduce(const T* in, size_t n, Func func, const mxx::comm& comm = mxx::comm()) {
    std::vector<T> result(n);
    allreduce(in, n, &result[0], func, comm);
    return result;
}